

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void apx_client_attach_connection(apx_client_t *self,apx_clientConnection_t *connection)

{
  apx_clientConnection_t *connection_local;
  apx_client_t *self_local;
  
  if ((self != (apx_client_t *)0x0) && (connection != (apx_clientConnection_t *)0x0)) {
    self->connection = connection;
    apx_clientConnection_set_client(connection,self);
    apx_clientConnection_attach_node_manager(connection,self->node_manager);
    apx_client_attach_local_nodes_to_connection(self);
  }
  return;
}

Assistant:

void apx_client_attach_connection(apx_client_t *self, apx_clientConnection_t *connection)
{
   if ( (self != NULL) && (connection != 0) )
   {
      self->connection = connection;
      apx_clientConnection_set_client(connection, self);
      apx_clientConnection_attach_node_manager(connection, self->node_manager);
      apx_client_attach_local_nodes_to_connection(self); //TODO: This should not be necessary as an explicit step.
                                                         // Merge functionality with call to to apx_clientConnection_attach_node_manager
   }
}